

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O3

void __thiscall deqp::gls::AttributePack::clearArrays(AttributePack *this)

{
  AttributeArray *this_00;
  pointer ppAVar1;
  pointer ppAVar2;
  
  ppAVar2 = (this->m_arrays).
            super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppAVar2 !=
      (this->m_arrays).
      super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      this_00 = *ppAVar2;
      if (this_00 != (AttributeArray *)0x0) {
        anon_unknown_1::AttributeArray::~AttributeArray(this_00);
      }
      operator_delete(this_00,0x58);
      ppAVar2 = ppAVar2 + 1;
    } while (ppAVar2 !=
             (this->m_arrays).
             super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    ppAVar1 = (this->m_arrays).
              super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (ppAVar2 != ppAVar1) {
      (this->m_arrays).
      super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppAVar1;
    }
  }
  return;
}

Assistant:

void AttributePack::clearArrays (void)
{
	for (std::vector<AttributeArray*>::iterator itr = m_arrays.begin(); itr != m_arrays.end(); itr++)
		delete *itr;
	m_arrays.clear();
}